

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ShaderBuiltinConstantCase::~ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase *this)

{
  ~ShaderBuiltinConstantCase(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

ShaderBuiltinConstantCase::~ShaderBuiltinConstantCase (void)
{
}